

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_crypto_tests.cpp
# Opt level: O2

void __thiscall wallet::wallet_crypto_tests::passphrase::test_method(passphrase *this)

{
  span<const_unsigned_char,_18446744073709551615UL> correct_iv;
  pointer puVar1;
  pointer puVar2;
  uint64_t uVar3;
  uint32_t rounds;
  long in_FS_OFFSET;
  span<const_unsigned_char,_18446744073709551615UL> correct_key;
  span<const_unsigned_char,_18446744073709551615UL> salt;
  Span<unsigned_char> bytes;
  span<const_unsigned_char,_18446744073709551615UL> salt_00;
  secure_allocator<char> local_81;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSalt;
  SecureString local_68;
  string hash;
  uchar local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = 0xde;
  local_28[3] = 0xad;
  local_28[4] = 0xbe;
  local_28[5] = 0xef;
  local_28[6] = '\0';
  local_28[7] = '\0';
  std::__cxx11::basic_string<char,std::char_traits<char>,secure_allocator<char>>::
  basic_string<secure_allocator<char>>
            ((basic_string<char,std::char_traits<char>,secure_allocator<char>> *)&hash,"test",
             &local_81);
  local_68.field_2._M_allocated_capacity = 0x62f63ab5bce3a0d4;
  local_68.field_2._8_8_ = 0x6a55f03df3988899;
  local_68._M_dataplus._M_p = (pointer)0xc3f4d57a07ba7afc;
  local_68._M_string_length = 0xd01048aa8d8d98a0;
  vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xaad16d5291262fcf;
  vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x69c3f78bfb960822;
  correct_iv._M_extent._M_extent_value = 0x10;
  correct_iv._M_ptr = (pointer)&vchSalt;
  correct_key._M_extent._M_extent_value = 0x20;
  correct_key._M_ptr = (pointer)&local_68;
  salt._M_extent._M_extent_value = 8;
  salt._M_ptr = local_28;
  TestCrypter::TestPassphrase(salt,(SecureString *)&hash,25000,correct_key,correct_iv);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> *)&hash);
  GetRandHash();
  base_blob<256u>::ToString_abi_cxx11_(&hash,(base_blob<256u> *)&local_68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&vchSalt,8,(allocator_type *)&local_68);
  bytes.m_size = (long)vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  bytes.m_data = vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  GetRandBytes(bytes);
  uVar3 = RandomMixin<FastRandomContext>::randbits<32>
                    (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.
                      super_RandomMixin<FastRandomContext>);
  puVar2 = vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar1 = vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,secure_allocator<char>>::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((basic_string<char,std::char_traits<char>,secure_allocator<char>> *)&local_68,
             hash._M_dataplus._M_p,hash._M_dataplus._M_p + hash._M_string_length);
  rounds = 30000;
  if ((uint)uVar3 < 30000) {
    rounds = (uint)uVar3;
  }
  salt_00._M_extent._M_extent_value = (long)puVar2 - (long)puVar1;
  salt_00._M_ptr = puVar1;
  TestCrypter::TestPassphrase
            (salt_00,&local_68,rounds,(span<const_unsigned_char,_18446744073709551615UL>)ZEXT816(0),
             (span<const_unsigned_char,_18446744073709551615UL>)ZEXT816(0));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::~basic_string
            (&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&hash);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(passphrase) {
    // These are expensive.

    TestCrypter::TestPassphrase("0000deadbeef0000"_hex_u8, "test", 25000,
                                "fc7aba077ad5f4c3a0988d8daa4810d0d4a0e3bcb53af662998898f33df0556a"_hex_u8,
                                "cf2f2691526dd1aa220896fb8bf7c369"_hex_u8);

    std::string hash(GetRandHash().ToString());
    std::vector<unsigned char> vchSalt(8);
    GetRandBytes(vchSalt);
    uint32_t rounds = m_rng.rand32();
    if (rounds > 30000)
        rounds = 30000;
    TestCrypter::TestPassphrase(vchSalt, SecureString(hash.begin(), hash.end()), rounds);
}